

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  int iVar4;
  int k;
  int n;
  list<int> l;
  int x;
  int local_40;
  int local_3c;
  list<int> local_38;
  int local_24;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1051a0) = 0;
  local_38.mHeader = (node *)operator_new(0x18);
  (local_38.mHeader)->data = 0;
  (local_38.mHeader)->prev = local_38.mHeader;
  (local_38.mHeader)->next = local_38.mHeader;
  local_38.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  if (0 < local_3c) {
    iVar4 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_24);
      pnVar2 = local_38.mHeader;
      pnVar3 = (node *)operator_new(0x18);
      pnVar1 = pnVar2->prev;
      pnVar3->data = local_24;
      pnVar3->prev = pnVar1;
      pnVar3->next = pnVar2;
      pnVar1->next = pnVar3;
      pnVar2->prev = pnVar3;
      local_38.mSize = local_38.mSize + 1;
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_3c);
  }
  std::istream::operator>>((istream *)&std::cin,&local_40);
  if (0 < local_40) {
    iVar4 = 0;
    do {
      pnVar1 = (local_38.mHeader)->prev;
      pnVar2 = (local_38.mHeader)->next;
      pnVar1->next = pnVar2;
      pnVar2->prev = pnVar1;
      (local_38.mHeader)->prev = pnVar2;
      (local_38.mHeader)->next = pnVar2->next;
      pnVar2->next = local_38.mHeader;
      (local_38.mHeader)->next->prev = local_38.mHeader;
      CP::list<int>::check_pointer(&local_38);
      CP::list<int>::print(&local_38);
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_40);
  }
  CP::list<int>::~list(&local_38);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::list<int> l;
  int n,k;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    l.push_back(x);
  }

  std::cin >> k;
  for (int i = 0;i < k;i++) {
    l.shift_left();
    l.check_pointer();
    l.print();
  }


}